

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O2

Money * operator-(Money *__return_storage_ptr__,Money *lhs,Money *rhs)

{
  bool bVar1;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  double local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&bStack_f8,(string *)lhs);
  std::__cxx11::string::string((string *)&local_d0,(string *)rhs);
  bVar1 = std::operator!=(&bStack_f8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&bStack_f8);
  if (!bVar1) {
    local_d8 = ((double)lhs->cents - (double)rhs->cents) / 100.0;
    std::__cxx11::string::string((string *)&bStack_f8,(string *)lhs);
    Money::Money(__return_storage_ptr__,local_d8,&bStack_f8);
    std::__cxx11::string::~string((string *)&bStack_f8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)lhs);
  std::operator+(&local_90,"Error in operator-() - Subtraction of \'",&local_50);
  std::operator+(&local_70,&local_90,"\' and \'");
  std::__cxx11::string::string((string *)&local_b0,(string *)rhs);
  std::operator+(&local_d0,&local_70,&local_b0);
  std::operator+(&bStack_f8,&local_d0,"\' is not defined.");
  error(&bStack_f8);
  std::__cxx11::string::~string((string *)&bStack_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Money operator-(const Money& lhs, const Money& rhs)
{
	if (lhs.get_currency() != rhs.get_currency())
	{
		error("Error in operator-() - Subtraction of '" 
			+ lhs.get_currency() + "' and '"
			+ rhs.get_currency() + "' is not defined.");
	}
	return Money{ (lhs.get_cents() - double(rhs.get_cents())) / 100.0, lhs.get_currency() };
}